

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XInclude.cpp
# Opt level: O3

bool __thiscall XIncludeErrorHandler::handleError(XIncludeErrorHandler *this,DOMError *domError)

{
  int iVar1;
  long *plVar2;
  wchar16 *pwVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  bool bVar7;
  StrX local_30;
  StrX local_28;
  
  iVar1 = (**(code **)(*(long *)domError + 0x10))(domError);
  if (iVar1 == 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"\nWarning at file ",0x11);
  }
  else {
    iVar1 = (**(code **)(*(long *)domError + 0x10))(domError);
    if (iVar1 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\nFatal Error at file ",0x15);
      this->fSawErrors = true;
      bVar7 = false;
      goto LAB_00102cc8;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\nError at file ",0xf)
    ;
    this->fSawErrors = true;
  }
  bVar7 = true;
LAB_00102cc8:
  plVar2 = (long *)(**(code **)(*(long *)domError + 0x20))(domError);
  pwVar3 = (wchar16 *)(**(code **)(*plVar2 + 0x38))(plVar2);
  pcVar4 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_28.fLocalForm = pcVar4;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106128);
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", line ",7);
  plVar2 = (long *)(**(code **)(*(long *)domError + 0x20))(domError);
  (**(code **)(*plVar2 + 0x10))(plVar2);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,", char ",7);
  plVar2 = (long *)(**(code **)(*(long *)domError + 0x20))(domError);
  (**(code **)(*plVar2 + 0x18))(plVar2);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n  Message: ",0xc);
  pwVar3 = (wchar16 *)(**(code **)(*(long *)domError + 0x18))(domError);
  pcVar4 = (char *)xercesc_4_0::XMLString::transcode
                             (pwVar3,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_30.fLocalForm = pcVar4;
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar4,sVar5);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  StrX::~StrX(&local_30);
  StrX::~StrX(&local_28);
  return bVar7;
}

Assistant:

bool XIncludeErrorHandler::handleError(const DOMError& domError)
{
	bool continueParsing = true;
    if (domError.getSeverity() == DOMError::DOM_SEVERITY_WARNING)
        std::cerr << "\nWarning at file ";
    else if (domError.getSeverity() == DOMError::DOM_SEVERITY_ERROR)
    {
        std::cerr << "\nError at file ";
        fSawErrors = true;
    }
	else {
        std::cerr << "\nFatal Error at file ";
		continueParsing = false;
        fSawErrors = true;
	}

    std::cerr << StrX(domError.getLocation()->getURI())
         << ", line " << domError.getLocation()->getLineNumber()
         << ", char " << domError.getLocation()->getColumnNumber()
         << "\n  Message: " << StrX(domError.getMessage()) << std::endl;

    return continueParsing;
}